

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_asn1.cc
# Opt level: O0

DH * DH_parse_parameters(CBS *cbs)

{
  bool bVar1;
  int iVar2;
  DH *__p;
  pointer pdVar3;
  size_t sVar4;
  ulong local_40;
  uint64_t priv_length;
  CBS child;
  unique_ptr<dh_st,_bssl::internal::Deleter> local_20;
  UniquePtr<DH> ret;
  CBS *cbs_local;
  
  ret._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_dh_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<dh_st,_bssl::internal::Deleter,_true,_true>)
                 (__uniq_ptr_data<dh_st,_bssl::internal::Deleter,_true,_true>)cbs;
  __p = DH_new();
  std::unique_ptr<dh_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<dh_st,bssl::internal::Deleter> *)&local_20,(pointer)__p);
  bVar1 = std::operator==(&local_20,(nullptr_t)0x0);
  if (bVar1) {
    cbs_local = (CBS *)0x0;
  }
  else {
    iVar2 = CBS_get_asn1((CBS *)ret._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_dh_st_*,_false>._M_head_impl,
                         (CBS *)&priv_length,0x20000010);
    if (iVar2 != 0) {
      pdVar3 = std::unique_ptr<dh_st,_bssl::internal::Deleter>::operator->(&local_20);
      iVar2 = parse_integer((CBS *)&priv_length,&pdVar3->p);
      if (iVar2 != 0) {
        pdVar3 = std::unique_ptr<dh_st,_bssl::internal::Deleter>::operator->(&local_20);
        iVar2 = parse_integer((CBS *)&priv_length,&pdVar3->g);
        if (iVar2 != 0) {
          sVar4 = CBS_len((CBS *)&priv_length);
          if (sVar4 != 0) {
            iVar2 = CBS_get_asn1_uint64((CBS *)&priv_length,&local_40);
            if ((iVar2 == 0) || (0xffffffff < local_40)) {
              ERR_put_error(5,0,0x68,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_asn1.cc"
                            ,0x40);
              cbs_local = (CBS *)0x0;
              goto LAB_002d9520;
            }
            pdVar3 = std::unique_ptr<dh_st,_bssl::internal::Deleter>::operator->(&local_20);
            pdVar3->priv_length = (uint)local_40;
          }
          sVar4 = CBS_len((CBS *)&priv_length);
          if (sVar4 == 0) {
            pdVar3 = std::unique_ptr<dh_st,_bssl::internal::Deleter>::get(&local_20);
            iVar2 = dh_check_params_fast(pdVar3);
            if (iVar2 == 0) {
              ERR_put_error(5,0,0x68,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_asn1.cc"
                            ,0x4c);
              cbs_local = (CBS *)0x0;
            }
            else {
              cbs_local = (CBS *)std::unique_ptr<dh_st,_bssl::internal::Deleter>::release(&local_20)
              ;
            }
          }
          else {
            ERR_put_error(5,0,0x68,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_asn1.cc"
                          ,0x47);
            cbs_local = (CBS *)0x0;
          }
          goto LAB_002d9520;
        }
      }
    }
    ERR_put_error(5,0,0x68,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_asn1.cc"
                  ,0x38);
    cbs_local = (CBS *)0x0;
  }
LAB_002d9520:
  child.len._4_4_ = 1;
  std::unique_ptr<dh_st,_bssl::internal::Deleter>::~unique_ptr(&local_20);
  return (DH *)cbs_local;
}

Assistant:

DH *DH_parse_parameters(CBS *cbs) {
  bssl::UniquePtr<DH> ret(DH_new());
  if (ret == nullptr) {
    return nullptr;
  }

  CBS child;
  if (!CBS_get_asn1(cbs, &child, CBS_ASN1_SEQUENCE) ||
      !parse_integer(&child, &ret->p) ||
      !parse_integer(&child, &ret->g)) {
    OPENSSL_PUT_ERROR(DH, DH_R_DECODE_ERROR);
    return nullptr;
  }

  uint64_t priv_length;
  if (CBS_len(&child) != 0) {
    if (!CBS_get_asn1_uint64(&child, &priv_length) ||
        priv_length > UINT_MAX) {
      OPENSSL_PUT_ERROR(DH, DH_R_DECODE_ERROR);
      return nullptr;
    }
    ret->priv_length = (unsigned)priv_length;
  }

  if (CBS_len(&child) != 0) {
    OPENSSL_PUT_ERROR(DH, DH_R_DECODE_ERROR);
    return nullptr;
  }

  if (!dh_check_params_fast(ret.get())) {
    OPENSSL_PUT_ERROR(DH, DH_R_DECODE_ERROR);
    return nullptr;
  }

  return ret.release();
}